

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O1

void __thiscall InterpTest::~InterpTest(InterpTest *this)

{
  pointer pRVar1;
  pointer puVar2;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__InterpTest_00243af8;
  if ((this->inst_).obj_ != (Instance *)0x0) {
    wabt::interp::Store::DeleteRoot((this->inst_).store_,(this->inst_).root_index_);
    (this->inst_).obj_ = (Instance *)0x0;
    (this->inst_).store_ = (Store *)0x0;
    (this->inst_).root_index_ = 0;
  }
  if ((this->mod_).obj_ != (Module *)0x0) {
    wabt::interp::Store::DeleteRoot((this->mod_).store_,(this->mod_).root_index_);
    (this->mod_).obj_ = (Module *)0x0;
    (this->mod_).store_ = (Store *)0x0;
    (this->mod_).root_index_ = 0;
  }
  wabt::interp::ModuleDesc::~ModuleDesc(&this->module_desc_);
  pRVar1 = (this->store_).roots_.list_.
           super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pRVar1 != (pointer)0x0) {
    operator_delete(pRVar1,(long)(this->store_).roots_.list_.
                                 super__Vector_base<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pRVar1);
  }
  wabt::interp::FreeList<wabt::interp::Object_*>::~FreeList(&(this->store_).objects_);
  std::
  _Rb_tree<wabt::interp::Thread_*,_wabt::interp::Thread_*,_std::_Identity<wabt::interp::Thread_*>,_std::less<wabt::interp::Thread_*>,_std::allocator<wabt::interp::Thread_*>_>
  ::_M_erase(&(this->store_).threads_._M_t,
             (_Link_type)
             (this->store_).threads_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  puVar2 = (this->store_).gc_context_.untraced_objects.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2,(long)(this->store_).gc_context_.untraced_objects.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar2);
  }
  std::_Bvector_base<std::allocator<bool>_>::_M_deallocate
            (&(this->store_).gc_context_.marks.super__Bvector_base<std::allocator<bool>_>);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

void ReadModule(const std::vector<u8>& data) {
    Errors errors;
    ReadBinaryOptions options;
    Result result = ReadBinaryInterp("<internal>", data.data(), data.size(),
                                     options, &errors, &module_desc_);
    ASSERT_EQ(Result::Ok, result)
        << FormatErrorsToString(errors, Location::Type::Binary);
  }